

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_by_code.c
# Opt level: O2

int archive_read_support_filter_by_code(archive *a,int filter_code)

{
  int iVar1;
  
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_support_filter_by_code");
  if (iVar1 != -0x1e) {
    switch(filter_code) {
    case 0:
      iVar1 = archive_read_support_filter_none(a);
      return iVar1;
    case 1:
      iVar1 = archive_read_support_filter_gzip(a);
      return iVar1;
    case 2:
      iVar1 = archive_read_support_filter_bzip2(a);
      return iVar1;
    case 3:
      iVar1 = archive_read_support_filter_compress(a);
      return iVar1;
    case 5:
      iVar1 = archive_read_support_filter_lzma(a);
      return iVar1;
    case 6:
      iVar1 = archive_read_support_filter_xz(a);
      return iVar1;
    case 7:
      iVar1 = archive_read_support_filter_uu(a);
      return iVar1;
    case 8:
      iVar1 = archive_read_support_filter_rpm(a);
      return iVar1;
    case 9:
      iVar1 = archive_read_support_filter_lzip(a);
      return iVar1;
    case 10:
      iVar1 = archive_read_support_filter_lrzip(a);
      return iVar1;
    case 0xb:
      iVar1 = archive_read_support_filter_lzop(a);
      return iVar1;
    case 0xc:
      iVar1 = archive_read_support_filter_grzip(a);
      return iVar1;
    case 0xd:
      iVar1 = archive_read_support_filter_lz4(a);
      return iVar1;
    case 0xe:
      iVar1 = archive_read_support_filter_zstd(a);
      return iVar1;
    }
  }
  return -0x1e;
}

Assistant:

int
archive_read_support_filter_by_code(struct archive *a, int filter_code)
{
	archive_check_magic(a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_filter_by_code");

	switch (filter_code) {
	case ARCHIVE_FILTER_NONE:
		return archive_read_support_filter_none(a);
	case ARCHIVE_FILTER_GZIP:
		return archive_read_support_filter_gzip(a);
	case ARCHIVE_FILTER_BZIP2:
		return archive_read_support_filter_bzip2(a);
	case ARCHIVE_FILTER_COMPRESS:
		return archive_read_support_filter_compress(a);
	case ARCHIVE_FILTER_LZMA:
		return archive_read_support_filter_lzma(a);
	case ARCHIVE_FILTER_XZ:
		return archive_read_support_filter_xz(a);
	case ARCHIVE_FILTER_UU:
		return archive_read_support_filter_uu(a);
	case ARCHIVE_FILTER_RPM:
		return archive_read_support_filter_rpm(a);
	case ARCHIVE_FILTER_LZIP:
		return archive_read_support_filter_lzip(a);
	case ARCHIVE_FILTER_LRZIP:
		return archive_read_support_filter_lrzip(a);
	case ARCHIVE_FILTER_LZOP:
		return archive_read_support_filter_lzop(a);
	case ARCHIVE_FILTER_GRZIP:
		return archive_read_support_filter_grzip(a);
	case ARCHIVE_FILTER_LZ4:
		return archive_read_support_filter_lz4(a);
	case ARCHIVE_FILTER_ZSTD:
		return archive_read_support_filter_zstd(a);
	}
	return (ARCHIVE_FATAL);
}